

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O0

void emit_loadi(ASMState *as,Reg r,int32_t i)

{
  MCode *pMVar1;
  MCode MVar2;
  MCode *pMStack_20;
  MCode rex;
  MCode *p;
  int32_t i_local;
  Reg r_local;
  ASMState *as_local;
  
  if ((i == 0) &&
     (((*as->mcp != '\x0f' || ((as->mcp[1] & 0xf0) != 0x80)) && ((*as->mcp & 0xf0) != 0x70)))) {
    emit_rr(as,0x330000fe,r,r);
  }
  else {
    pMVar1 = as->mcp;
    *(int32_t *)(pMVar1 + -4) = i;
    pMVar1[-5] = ((byte)r & 7) + 0xb8;
    pMStack_20 = pMVar1 + -5;
    MVar2 = ((byte)(r >> 3) & 1) + 0x40;
    if (MVar2 != '@') {
      pMStack_20 = pMVar1 + -6;
      pMVar1[-6] = MVar2;
    }
    as->mcp = pMStack_20;
  }
  return;
}

Assistant:

static void emit_loadi(ASMState *as, Reg r, int32_t i)
{
  /* XOR r,r is shorter, but modifies the flags. This is bad for HIOP/jcc. */
  if (i == 0 && !(LJ_32 && (IR(as->curins)->o == IR_HIOP ||
			    (as->curins+1 < as->T->nins &&
			     IR(as->curins+1)->o == IR_HIOP))) &&
		!((*as->mcp == 0x0f && (as->mcp[1] & 0xf0) == XI_JCCn) ||
		  (*as->mcp & 0xf0) == XI_JCCs)) {
    emit_rr(as, XO_ARITH(XOg_XOR), r, r);
  } else {
    MCode *p = as->mcp;
    *(int32_t *)(p-4) = i;
    p[-5] = (MCode)(XI_MOVri+(r&7));
    p -= 5;
    REXRB(p, 0, r);
    as->mcp = p;
  }
}